

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O3

ostream * eglu::operator<<(ostream *str,ContextAttribListFmt *fmt)

{
  uint uVar1;
  ContextAttribValueFmt in_RAX;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  ContextAttribValueFmt CVar6;
  char *pcVar7;
  ContextAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  iVar5 = 0;
  do {
    uVar1 = *(uint *)(*(long *)fmt + (long)iVar5 * 4);
    CVar6.value = 0;
    CVar6.attribute = uVar1;
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    }
    if ((int)uVar1 < 0x3097) {
      pcVar7 = "EGL_CONFIG_ID";
      if (uVar1 != 0x3028) {
        if (uVar1 != 0x3086) {
          if (uVar1 == 0x3038) {
            pcVar7 = "EGL_NONE";
            lVar4 = 8;
            poVar3 = str;
          }
          else {
LAB_003d7cd6:
            local_38 = CVar6;
            poVar3 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_38,str);
            pcVar7 = ", ???";
            lVar4 = 5;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar4);
          std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
          return str;
        }
        pcVar7 = "EGL_RENDER_BUFFER";
      }
    }
    else if (uVar1 == 0x3097) {
      pcVar7 = "EGL_CONTEXT_CLIENT_TYPE";
    }
    else {
      if (uVar1 != 0x3098) goto LAB_003d7cd6;
      pcVar7 = "EGL_CONTEXT_CLIENT_VERSION";
    }
    sVar2 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(str,pcVar7,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    local_38.value = *(int *)(*(long *)fmt + (long)(iVar5 + 1) * 4);
    local_38.attribute = uVar1;
    operator<<(str,&local_38);
    iVar5 = iVar5 + 2;
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ContextAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getContextAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getContextAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}